

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

size_t SSL_get0_certificate_types(SSL *ssl,uint8_t **out_types)

{
  SSL_HANDSHAKE *pSVar1;
  size_t sVar2;
  uint8_t *puVar3;
  
  sVar2 = 0;
  puVar3 = (uint8_t *)0x0;
  if ((ssl->field_0xa4 & 1) == 0) {
    pSVar1 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    if (pSVar1 == (SSL_HANDSHAKE *)0x0) {
      sVar2 = 0;
      puVar3 = (uint8_t *)0x0;
    }
    else {
      puVar3 = (pSVar1->certificate_types).data_;
      sVar2 = (pSVar1->certificate_types).size_;
    }
  }
  *out_types = puVar3;
  return sVar2;
}

Assistant:

size_t SSL_get0_certificate_types(const SSL *ssl, const uint8_t **out_types) {
  Span<const uint8_t> types;
  if (!ssl->server && ssl->s3->hs != nullptr) {
    types = ssl->s3->hs->certificate_types;
  }
  *out_types = types.data();
  return types.size();
}